

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# template_modifiers_unittest.cc
# Opt level: O0

void Test_TemplateModifiers_XmlEscape::Run(void)

{
  TemplateString TVar1;
  TemplateString TVar2;
  TemplateString TVar3;
  TemplateString TVar4;
  TemplateString TVar5;
  TemplateString TVar6;
  TemplateString TVar7;
  TemplateString TVar8;
  TemplateString TVar9;
  TemplateString TVar10;
  TemplateString TVar11;
  TemplateString TVar12;
  TemplateString TVar13;
  TemplateString TVar14;
  int iVar15;
  char *pcVar16;
  TemplateString local_350;
  TemplateString local_330;
  TemplateString local_310;
  TemplateString local_2f0;
  TemplateString local_2d0;
  TemplateString local_2b0;
  TemplateString local_290;
  TemplateDictionaryPeer local_270;
  TemplateDictionaryPeer peer;
  size_t sStack_260;
  undefined8 local_258;
  TemplateId TStack_250;
  TemplateString local_248;
  TemplateString local_228;
  TemplateString local_208;
  TemplateString local_1e8;
  TemplateString local_1c8;
  TemplateString local_1a8;
  TemplateString local_188;
  TemplateString local_168;
  TemplateString local_148;
  TemplateString local_128;
  TemplateString local_108;
  TemplateString local_e8;
  TemplateString local_b8;
  TemplateString local_98;
  TemplateDictionary local_78 [8];
  TemplateDictionary dict;
  
  ctemplate::TemplateString::TemplateString(&local_98,"TestXmlEscape");
  ctemplate::TemplateDictionary::TemplateDictionary(local_78,&local_98,(UnsafeArena *)0x0);
  ctemplate::TemplateString::TemplateString(&local_b8,"no XML");
  ctemplate::TemplateString::TemplateString(&local_e8,"");
  TVar1.length_ = local_b8.length_;
  TVar1.ptr_ = local_b8.ptr_;
  TVar1.is_immutable_ = local_b8.is_immutable_;
  TVar1._17_7_ = local_b8._17_7_;
  TVar1.id_ = local_b8.id_;
  TVar8.length_ = local_e8.length_;
  TVar8.ptr_ = local_e8.ptr_;
  TVar8.is_immutable_ = local_e8.is_immutable_;
  TVar8._17_7_ = local_e8._17_7_;
  TVar8.id_ = local_e8.id_;
  ctemplate::TemplateDictionary::SetEscapedValue(TVar1,TVar8,(TemplateModifier *)local_78);
  ctemplate::TemplateString::TemplateString(&local_108,"easy XML");
  ctemplate::TemplateString::TemplateString(&local_128,"xoo");
  TVar2.length_ = local_108.length_;
  TVar2.ptr_ = local_108.ptr_;
  TVar2.is_immutable_ = local_108.is_immutable_;
  TVar2._17_7_ = local_108._17_7_;
  TVar2.id_ = local_108.id_;
  TVar9.length_ = local_128.length_;
  TVar9.ptr_ = local_128.ptr_;
  TVar9.is_immutable_ = local_128.is_immutable_;
  TVar9._17_7_ = local_128._17_7_;
  TVar9.id_ = local_128.id_;
  ctemplate::TemplateDictionary::SetEscapedValue(TVar2,TVar9,(TemplateModifier *)local_78);
  ctemplate::TemplateString::TemplateString(&local_148,"harder XML-1");
  ctemplate::TemplateString::TemplateString(&local_168,"<>&\'\"");
  TVar3.length_ = local_148.length_;
  TVar3.ptr_ = local_148.ptr_;
  TVar3.is_immutable_ = local_148.is_immutable_;
  TVar3._17_7_ = local_148._17_7_;
  TVar3.id_ = local_148.id_;
  TVar10.length_ = local_168.length_;
  TVar10.ptr_ = local_168.ptr_;
  TVar10.is_immutable_ = local_168.is_immutable_;
  TVar10._17_7_ = local_168._17_7_;
  TVar10.id_ = local_168.id_;
  ctemplate::TemplateDictionary::SetEscapedValue(TVar3,TVar10,(TemplateModifier *)local_78);
  ctemplate::TemplateString::TemplateString(&local_188,"harder XML-2");
  ctemplate::TemplateString::TemplateString(&local_1a8,"Hello<script>alert(\'&\')</script>");
  TVar4.length_ = local_188.length_;
  TVar4.ptr_ = local_188.ptr_;
  TVar4.is_immutable_ = local_188.is_immutable_;
  TVar4._17_7_ = local_188._17_7_;
  TVar4.id_ = local_188.id_;
  TVar11.length_ = local_1a8.length_;
  TVar11.ptr_ = local_1a8.ptr_;
  TVar11.is_immutable_ = local_1a8.is_immutable_;
  TVar11._17_7_ = local_1a8._17_7_;
  TVar11.id_ = local_1a8.id_;
  ctemplate::TemplateDictionary::SetEscapedValue(TVar4,TVar11,(TemplateModifier *)local_78);
  ctemplate::TemplateString::TemplateString(&local_1c8,"hardest XML");
  ctemplate::TemplateString::TemplateString(&local_1e8,"<<b>>&!\'\'\"\"foo");
  TVar5.length_ = local_1c8.length_;
  TVar5.ptr_ = local_1c8.ptr_;
  TVar5.is_immutable_ = local_1c8.is_immutable_;
  TVar5._17_7_ = local_1c8._17_7_;
  TVar5.id_ = local_1c8.id_;
  TVar12.length_ = local_1e8.length_;
  TVar12.ptr_ = local_1e8.ptr_;
  TVar12.is_immutable_ = local_1e8.is_immutable_;
  TVar12._17_7_ = local_1e8._17_7_;
  TVar12.id_ = local_1e8.id_;
  ctemplate::TemplateDictionary::SetEscapedValue(TVar5,TVar12,(TemplateModifier *)local_78);
  ctemplate::TemplateString::TemplateString(&local_208,"Spacey XML");
  ctemplate::TemplateString::TemplateString(&local_228," \r\n\f");
  TVar6.length_ = local_208.length_;
  TVar6.ptr_ = local_208.ptr_;
  TVar6.is_immutable_ = local_208.is_immutable_;
  TVar6._17_7_ = local_208._17_7_;
  TVar6.id_ = local_208.id_;
  TVar13.length_ = local_228.length_;
  TVar13.ptr_ = local_228.ptr_;
  TVar13.is_immutable_ = local_228.is_immutable_;
  TVar13._17_7_ = local_228._17_7_;
  TVar13.id_ = local_228.id_;
  ctemplate::TemplateDictionary::SetEscapedValue(TVar6,TVar13,(TemplateModifier *)local_78);
  ctemplate::TemplateString::TemplateString(&local_248,"XML with control chars");
  ctemplate::TemplateString::TemplateString
            ((TemplateString *)&peer,"\x01\x02\x03\t\n\v\r\x15\x16\x1f");
  TVar7.length_ = local_248.length_;
  TVar7.ptr_ = local_248.ptr_;
  TVar7.is_immutable_ = local_248.is_immutable_;
  TVar7._17_7_ = local_248._17_7_;
  TVar7.id_ = local_248.id_;
  TVar14.length_ = sStack_260;
  TVar14.ptr_ = (char *)peer.dict_;
  TVar14._16_8_ = local_258;
  TVar14.id_ = TStack_250;
  ctemplate::TemplateDictionary::SetEscapedValue(TVar7,TVar14,(TemplateModifier *)local_78);
  ctemplate::TemplateDictionaryPeer::TemplateDictionaryPeer(&local_270,local_78);
  ctemplate::TemplateString::TemplateString(&local_290,"no XML");
  pcVar16 = ctemplate::TemplateDictionaryPeer::GetSectionValue(&local_270,&local_290);
  iVar15 = strcmp(pcVar16,"");
  if (iVar15 != 0) {
    fprintf(_stderr,"Check failed: %s\n","strcmp(peer.GetSectionValue(\"no XML\"), \"\") == 0");
    exit(1);
  }
  ctemplate::TemplateString::TemplateString(&local_2b0,"easy XML");
  pcVar16 = ctemplate::TemplateDictionaryPeer::GetSectionValue(&local_270,&local_2b0);
  iVar15 = strcmp(pcVar16,"xoo");
  if (iVar15 != 0) {
    fprintf(_stderr,"Check failed: %s\n","strcmp(peer.GetSectionValue(\"easy XML\"), \"xoo\") == 0")
    ;
    exit(1);
  }
  ctemplate::TemplateString::TemplateString(&local_2d0,"harder XML-1");
  pcVar16 = ctemplate::TemplateDictionaryPeer::GetSectionValue(&local_270,&local_2d0);
  iVar15 = strcmp(pcVar16,"&lt;&gt;&amp;&#39;&quot;");
  if (iVar15 != 0) {
    fprintf(_stderr,"Check failed: %s\n",
            "strcmp(peer.GetSectionValue(\"harder XML-1\"), \"&lt;&gt;&amp;&#39;&quot;\") == 0");
    exit(1);
  }
  ctemplate::TemplateString::TemplateString(&local_2f0,"harder XML-2");
  pcVar16 = ctemplate::TemplateDictionaryPeer::GetSectionValue(&local_270,&local_2f0);
  iVar15 = strcmp(pcVar16,"Hello&lt;script&gt;alert(&#39;&amp;&#39;)&lt;/script&gt;");
  if (iVar15 == 0) {
    ctemplate::TemplateString::TemplateString(&local_310,"hardest XML");
    pcVar16 = ctemplate::TemplateDictionaryPeer::GetSectionValue(&local_270,&local_310);
    iVar15 = strcmp(pcVar16,"&lt;&lt;b&gt;&gt;&amp;!&#39;&#39;&quot;&quot;foo");
    if (iVar15 != 0) {
      fprintf(_stderr,"Check failed: %s\n",
              "strcmp(peer.GetSectionValue(\"hardest XML\"), \"&lt;&lt;b&gt;&gt;&amp;!&#39;&#39;&quot;&quot;foo\") == 0"
             );
      exit(1);
    }
    ctemplate::TemplateString::TemplateString(&local_330,"Spacey XML");
    pcVar16 = ctemplate::TemplateDictionaryPeer::GetSectionValue(&local_270,&local_330);
    iVar15 = strcmp(pcVar16," \r\n ");
    if (iVar15 == 0) {
      ctemplate::TemplateString::TemplateString(&local_350,"XML with control chars");
      pcVar16 = ctemplate::TemplateDictionaryPeer::GetSectionValue(&local_270,&local_350);
      iVar15 = strcmp(pcVar16,"   \t\n \r   ");
      if (iVar15 == 0) {
        ctemplate::TemplateDictionary::~TemplateDictionary(local_78);
        return;
      }
      fprintf(_stderr,"Check failed: %s\n",
              "strcmp(peer.GetSectionValue(\"XML with control chars\"), \"   \\t\\n \\r   \") == 0")
      ;
      exit(1);
    }
    fprintf(_stderr,"Check failed: %s\n",
            "strcmp(peer.GetSectionValue(\"Spacey XML\"), \" \\r\\n \") == 0");
    exit(1);
  }
  fprintf(_stderr,"Check failed: %s\n",
          "strcmp(peer.GetSectionValue(\"harder XML-2\"), \"Hello&lt;script&gt;alert(&#39;&amp;&#39;)&lt;/script&gt;\") == 0"
         );
  exit(1);
}

Assistant:

TEST(TemplateModifiers, XmlEscape) {
  GOOGLE_NAMESPACE::TemplateDictionary dict("TestXmlEscape", NULL);
  dict.SetEscapedValue("no XML", "",
                       GOOGLE_NAMESPACE::xml_escape);
  dict.SetEscapedValue("easy XML", "xoo",
                       GOOGLE_NAMESPACE::xml_escape);
  dict.SetEscapedValue("harder XML-1", "<>&'\"",
                       GOOGLE_NAMESPACE::xml_escape);
  dict.SetEscapedValue("harder XML-2", "Hello<script>alert('&')</script>",
                       GOOGLE_NAMESPACE::xml_escape);
  dict.SetEscapedValue("hardest XML", "<<b>>&!''\"\"foo",
                       GOOGLE_NAMESPACE::xml_escape);
  // Characters 0x00-0x1F (except \t, \r and \n) are not valid for XML and
  // compliant parsers are allowed to die when they encounter them. They
  // should be replaced with spaces.
  dict.SetEscapedValue("Spacey XML", " \r\n\f",
                       GOOGLE_NAMESPACE::xml_escape);
  dict.SetEscapedValue("XML with control chars",
                       "\x01\x02\x03\x09\x0A\x0B\x0D\x15\x16\x1F",
                       GOOGLE_NAMESPACE::xml_escape);

  GOOGLE_NAMESPACE::TemplateDictionaryPeer peer(&dict);  // peer can look inside dicts
  EXPECT_STREQ(peer.GetSectionValue("no XML"), "");
  EXPECT_STREQ(peer.GetSectionValue("easy XML"), "xoo");
  EXPECT_STREQ(peer.GetSectionValue("harder XML-1"),
               "&lt;&gt;&amp;&#39;&quot;");
  EXPECT_STREQ(peer.GetSectionValue("harder XML-2"),
               "Hello&lt;script&gt;alert(&#39;&amp;&#39;)&lt;/script&gt;");
  EXPECT_STREQ(peer.GetSectionValue("hardest XML"),
               "&lt;&lt;b&gt;&gt;&amp;!&#39;&#39;&quot;&quot;foo");
  EXPECT_STREQ(peer.GetSectionValue("Spacey XML"),
               " \r\n ");
  EXPECT_STREQ(peer.GetSectionValue("XML with control chars"),
               "   \t\n \r   ");
}